

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
::~raw_hash_set(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>
                *this)

{
  void *p;
  size_t n;
  
  if ((this->settings_).
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ != 0) {
    destroy_slots(this);
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ == 0) {
      __assert_fail("(capacity() != 0) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe4f,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>>::dealloc() [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>]"
                   );
    }
    if (((this->settings_).
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         size_ & 1) != 0) {
      CommonFields::backing_array_start((CommonFields *)this);
    }
    p = CommonFields::backing_array_start((CommonFields *)this);
    n = CommonFields::alloc_size((CommonFields *)this,0x20,8);
    Deallocate<8ul,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
              ((allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>
                *)this,p,n);
  }
  (this->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  return;
}

Assistant:

~raw_hash_set() {
    destructor_impl();
#ifndef NDEBUG
    common().set_capacity(InvalidCapacity::kDestroyed);
#endif
  }